

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,floating_type x,floating_format_info *fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  undefined1 *in_RDI;
  region *this_00;
  region *in_stack_ffffffffffffff58;
  value_with_format<double,_toml::floating_format_info> *in_stack_ffffffffffffff60;
  
  *in_RDI = 3;
  floating_format_info::floating_format_info
            ((floating_format_info *)in_stack_ffffffffffffff60,
             (floating_format_info *)in_stack_ffffffffffffff58);
  toml::detail::value_with_format<double,_toml::floating_format_info>::value_with_format
            (in_stack_ffffffffffffff60,(value_type_conflict6)in_stack_ffffffffffffff58,
             (format_type *)0x7594d6);
  floating_format_info::~floating_format_info((floating_format_info *)0x7594e2);
  this_00 = (region *)(in_RDI + 0x48);
  toml::detail::region::region(this_00,in_stack_ffffffffffffff58);
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff58);
  return;
}

Assistant:

basic_value(floating_type x, floating_format_info fmt, std::vector<std::string> com, region_type reg)
        : type_(value_t::floating), floating_(floating_storage(std::move(x), std::move(fmt))),
          region_(std::move(reg)), comments_(std::move(com))
    {}